

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

WeakArenaReference<Js::IDiagObjectModelWalkerBase> * __thiscall
Js::RecyclableCollectionObjectDisplay<Js::JavascriptWeakSet>::CreateWalker
          (RecyclableCollectionObjectDisplay<Js::JavascriptWeakSet> *this)

{
  ThreadContext *this_00;
  DebugManager *this_01;
  HeapAllocator *alloc;
  WeakArenaReference<Js::IDiagObjectModelWalkerBase> *this_02;
  TrackAllocData local_48;
  ReferencedArenaAdapter *local_20;
  ReferencedArenaAdapter *pRefArena;
  RecyclableCollectionObjectDisplay<Js::JavascriptWeakSet> *this_local;
  
  if (this->walker != (RecyclableCollectionObjectWalker<Js::JavascriptWeakSet> *)0x0) {
    pRefArena = (ReferencedArenaAdapter *)this;
    this_00 = ScriptContext::GetThreadContext(this->scriptContext);
    this_01 = ThreadContext::GetDebugManager(this_00);
    local_20 = DebugManager::GetDiagnosticArena(this_01);
    if (local_20 != (ReferencedArenaAdapter *)0x0) {
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_48,
                 (type_info *)&Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>::typeinfo,
                 0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                 ,0xe33);
      alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_48);
      this_02 = (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)
                new<Memory::HeapAllocator>(0x10,alloc,0x350bd0);
      Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>::WeakArenaReference
                (this_02,local_20,&this->walker->super_IDiagObjectModelWalkerBase);
      return this_02;
    }
  }
  return (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)0x0;
}

Assistant:

WeakArenaReference<IDiagObjectModelWalkerBase>* RecyclableCollectionObjectDisplay<TData>::CreateWalker()
    {
        if (walker)
        {
            ReferencedArenaAdapter* pRefArena = scriptContext->GetThreadContext()->GetDebugManager()->GetDiagnosticArena();
            if (pRefArena)
            {
                return HeapNew(WeakArenaReference<IDiagObjectModelWalkerBase>, pRefArena, walker);
            }
        }
        return nullptr;
    }